

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void uv__print_handles(uv_loop_t *loop,int only_active)

{
  int in_ESI;
  uv_loop_t *in_RDI;
  uv_handle_t *h;
  QUEUE *q;
  char *type;
  undefined8 *local_20;
  char *local_18;
  uv_loop_t *local_8;
  
  local_8 = in_RDI;
  if (in_RDI == (uv_loop_t *)0x0) {
    local_8 = uv_default_loop();
  }
  for (local_20 = (undefined8 *)local_8->handle_queue[0]; (void **)local_20 != local_8->handle_queue
      ; local_20 = (undefined8 *)*local_20) {
    if ((in_ESI == 0) || ((*(uint *)(local_20 + 2) & 0x4000) != 0)) {
      switch(*(undefined4 *)(local_20 + -1)) {
      case 1:
        local_18 = "async";
        break;
      case 2:
        local_18 = "check";
        break;
      case 3:
        local_18 = "fs_event";
        break;
      case 4:
        local_18 = "fs_poll";
        break;
      case 5:
        local_18 = "handle";
        break;
      case 6:
        local_18 = "idle";
        break;
      case 7:
        local_18 = "pipe";
        break;
      case 8:
        local_18 = "poll";
        break;
      case 9:
        local_18 = "prepare";
        break;
      case 10:
        local_18 = "process";
        break;
      case 0xb:
        local_18 = "stream";
        break;
      case 0xc:
        local_18 = "tcp";
        break;
      case 0xd:
        local_18 = "timer";
        break;
      case 0xe:
        local_18 = "tty";
        break;
      case 0xf:
        local_18 = "udp";
        break;
      case 0x10:
        local_18 = "signal";
        break;
      default:
        local_18 = "<unknown>";
      }
      fprintf(_stderr,"[%c%c%c] %-8s %p\n",
              (ulong)(uint)(int)"R-"[(int)(uint)(((*(uint *)(local_20 + 2) & 0x2000) != 0 ^ 0xffU) &
                                                1)],
              (ulong)(uint)(int)"A-"[(int)(uint)(((*(uint *)(local_20 + 2) & 0x4000) != 0 ^ 0xffU) &
                                                1)],
              (ulong)(uint)(int)"I-"[(int)(uint)(((*(uint *)(local_20 + 2) & 0x8000) != 0 ^ 0xffU) &
                                                1)],local_18,local_20 + -4);
    }
  }
  return;
}

Assistant:

static void uv__print_handles(uv_loop_t* loop, int only_active) {
  const char* type;
  QUEUE* q;
  uv_handle_t* h;

  if (loop == NULL)
    loop = uv_default_loop();

  QUEUE_FOREACH(q, &loop->handle_queue) {
    h = QUEUE_DATA(q, uv_handle_t, handle_queue);

    if (only_active && !uv__is_active(h))
      continue;

    switch (h->type) {
#define X(uc, lc) case UV_##uc: type = #lc; break;
      UV_HANDLE_TYPE_MAP(X)
#undef X
      default: type = "<unknown>";
    }

    fprintf(stderr,
            "[%c%c%c] %-8s %p\n",
            "R-"[!(h->flags & UV__HANDLE_REF)],
            "A-"[!(h->flags & UV__HANDLE_ACTIVE)],
            "I-"[!(h->flags & UV__HANDLE_INTERNAL)],
            type,
            (void*)h);
  }
}